

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLcode Curl_headers_push(Curl_easy *data,char *header,uchar type)

{
  CURLcode CVar1;
  void *ne;
  bool bVar2;
  CURLcode result;
  Curl_header_store *hs;
  size_t hlen;
  char *end;
  char *name;
  char *value;
  char *pcStack_20;
  uchar type_local;
  char *header_local;
  Curl_easy *data_local;
  
  name = (char *)0x0;
  end = (char *)0x0;
  if ((*header == '\r') || (*header == '\n')) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    value._7_1_ = type;
    pcStack_20 = header;
    header_local = (char *)data;
    hlen = (size_t)strchr(header,0xd);
    if (((char *)hlen == (char *)0x0) &&
       (hlen = (size_t)strchr(pcStack_20,10), (char *)hlen == (char *)0x0)) {
      data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
    }
    else {
      hs = (Curl_header_store *)(hlen - (long)pcStack_20);
      if ((*pcStack_20 == ' ') || (*pcStack_20 == '\t')) {
        if (*(long *)(header_local + 0x1310) != 0) {
          CVar1 = unfold_value((Curl_easy *)header_local,pcStack_20,(size_t)hs);
          return CVar1;
        }
        while( true ) {
          bVar2 = false;
          if ((hs != (Curl_header_store *)0x0) && (bVar2 = true, *pcStack_20 != ' ')) {
            bVar2 = *pcStack_20 == '\t';
          }
          if (!bVar2) break;
          pcStack_20 = pcStack_20 + 1;
          hs = (Curl_header_store *)&hs[-1].field_0x37;
        }
        if (hs == (Curl_header_store *)0x0) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
      }
      ne = (*Curl_ccalloc)(1,(size_t)(hs + 1));
      if (ne == (void *)0x0) {
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        memcpy((void *)((long)ne + 0x35),pcStack_20,(size_t)hs);
        *(char *)((long)ne + (long)hs->buffer) = '\0';
        CVar1 = namevalue((char *)((long)ne + 0x35),(size_t)hs,(uint)value._7_1_,&end,&name);
        data_local._4_4_ = CVar1;
        if (CVar1 == CURLE_OK) {
          *(char **)((long)ne + 0x20) = end;
          *(char **)((long)ne + 0x28) = name;
          *(byte *)((long)ne + 0x34) = value._7_1_;
          *(undefined4 *)((long)ne + 0x30) = *(undefined4 *)(header_local + 0xce8);
          Curl_llist_append((Curl_llist *)(header_local + 0x1290),ne,(Curl_llist_node *)ne);
          *(void **)(header_local + 0x1310) = ne;
        }
        else {
          (*Curl_cfree)(ne);
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_headers_push(struct Curl_easy *data, const char *header,
                           unsigned char type)
{
  char *value = NULL;
  char *name = NULL;
  char *end;
  size_t hlen; /* length of the incoming header */
  struct Curl_header_store *hs;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  if((header[0] == '\r') || (header[0] == '\n'))
    /* ignore the body separator */
    return CURLE_OK;

  end = strchr(header, '\r');
  if(!end) {
    end = strchr(header, '\n');
    if(!end)
      /* neither CR nor LF as terminator is not a valid header */
      return CURLE_WEIRD_SERVER_REPLY;
  }
  hlen = end - header;

  if((header[0] == ' ') || (header[0] == '\t')) {
    if(data->state.prevhead)
      /* line folding, append value to the previous header's value */
      return unfold_value(data, header, hlen);
    else {
      /* cannot unfold without a previous header. Instead of erroring, just
         pass the leading blanks. */
      while(hlen && ISBLANK(*header)) {
        header++;
        hlen--;
      }
      if(!hlen)
        return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  hs = calloc(1, sizeof(*hs) + hlen);
  if(!hs)
    return CURLE_OUT_OF_MEMORY;
  memcpy(hs->buffer, header, hlen);
  hs->buffer[hlen] = 0; /* nul terminate */

  result = namevalue(hs->buffer, hlen, type, &name, &value);
  if(!result) {
    hs->name = name;
    hs->value = value;
    hs->type = type;
    hs->request = data->state.requests;

    /* insert this node into the list of headers */
    Curl_llist_append(&data->state.httphdrs, hs, &hs->node);
    data->state.prevhead = hs;
  }
  else
    free(hs);
  return result;
}